

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O1

void __thiscall QFormLayout::addItem(QFormLayout *this,QLayoutItem *item)

{
  QFormLayoutPrivate *this_00;
  int rowCnt;
  int r;
  long in_FS_OFFSET;
  QFormLayoutItem *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFormLayoutPrivate **)&(this->super_QLayout).field_0x8;
  local_30 = (QFormLayoutItem *)0x0;
  r = (int)((ulong)(this_00->m_matrix).m_storage.d.size >> 1);
  QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::insertRow(&this_00->m_matrix,r,&local_30);
  QFormLayoutPrivate::setItem(this_00,r,FieldRole,item);
  (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFormLayout::addItem(QLayoutItem *item)
{
    Q_D(QFormLayout);

    int row = d->insertRow(d->m_matrix.rowCount());
    d->setItem(row, FieldRole, item);
    invalidate();
}